

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_erase_result_t art_erase_at(art_node_t *node,art_key_chunk_t *key,uint8_t depth)

{
  art_node_t key1_to;
  art_key_chunk_t key_chunk;
  uint8_t offset;
  art_node_t aVar1;
  art_node_t *node_00;
  art_node_t *new_child;
  long lVar2;
  uint8_t in_R9B;
  art_val_t *paVar3;
  art_erase_result_t aVar4;
  
  if (((ulong)node & 1) == 0) {
    key1_to = node[1];
    paVar3 = (art_val_t *)0x0;
    aVar1 = (art_node_t)
            art_common_prefix((art_key_chunk_t *)(node + 2),'\0',(uint8_t)key1_to,key,depth,in_R9B);
    if (aVar1 == key1_to) {
      key_chunk = key[(ulong)(byte)key1_to + (ulong)depth];
      node_00 = art_find_child((art_inner_node_t *)node,key_chunk);
      if (node_00 != (art_node_t *)0x0) {
        aVar4 = art_erase_at(node_00,key,(char)((ulong)(byte)key1_to + (ulong)depth) + '\x01');
        paVar3 = aVar4.value_erased;
        new_child = aVar4.rootmost_node;
        if (paVar3 != (art_val_t *)0x0) {
          if (new_child == (art_node_t *)0x0) {
            node = art_node_erase((art_inner_node_t *)node,key_chunk);
          }
          else if (new_child != node_00) {
            art_replace((art_inner_node_t *)node,key_chunk,new_child);
          }
          goto LAB_001106d4;
        }
      }
LAB_001106cf:
      node = (art_node_t *)0x0;
      paVar3 = (art_val_t *)0x0;
      goto LAB_001106d4;
    }
  }
  else {
    paVar3 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      if (paVar3->key[lVar2] != key[lVar2]) {
        if (lVar2 != 6) goto LAB_001106cf;
        break;
      }
    }
  }
  node = (art_node_t *)0x0;
LAB_001106d4:
  aVar4.value_erased = paVar3;
  aVar4.rootmost_node = node;
  return aVar4;
}

Assistant:

static art_erase_result_t art_erase_at(art_node_t *node,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = NULL;
    result.value_erased = NULL;

    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.value_erased = (art_val_t *)leaf;
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)node;
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_node_t *child = art_find_child(inner_node, key_chunk);
    if (child == NULL) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with the
    // child in the node.
    art_erase_result_t child_result =
        art_erase_at(child, key, depth + common_prefix + 1);
    if (child_result.value_erased == NULL) {
        return result;
    }
    result.value_erased = child_result.value_erased;
    result.rootmost_node = node;
    if (child_result.rootmost_node == NULL) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node = art_node_erase(inner_node, key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, key_chunk, child_result.rootmost_node);
    }
    return result;
}